

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void LiteScript::StateExecutor::I_VALUE_STRING(State *state,Instruction *instr)

{
  Object *pOVar1;
  _Alloc_hider local_40;
  
  state->line_num = state->line_num + 1;
  if (instr->comp_type == '\x04') {
    Memory::Create((Memory *)&stack0xffffffffffffffc0,(Type *)state->memory);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&state->op_lifo,(Variable *)&stack0xffffffffffffffc0);
    Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
    String::String((String *)&stack0xffffffffffffffc0,(instr->comp_value).v_string);
    pOVar1 = Variable::operator->
                       ((state->op_lifo).
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
    String::operator=((String *)pOVar1->data,(String *)&stack0xffffffffffffffc0);
    if ((Object *)local_40._M_p != (Object *)&stack0xffffffffffffffd0) {
      operator_delete(local_40._M_p);
    }
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_STRING(State& state, Instruction& instr) {
    state.line_num++;
    if (instr.comp_type != Instruction::CompType::COMP_TYPE_STRING)
        return;
    state.op_lifo.push_back(state.memory.Create(Type::STRING));
    state.op_lifo.back()->GetData<String>() = String(instr.comp_value.v_string);
}